

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

void __thiscall ON_SubD_FixedSizeHeap::Destroy(ON_SubD_FixedSizeHeap *this)

{
  ON_SubDVertex *pOVar1;
  ON_SubDEdge *pOVar2;
  ON_SubDFace *pOVar3;
  ON__UINT_PTR *pOVar4;
  ON_SubD_FixedSizeHeap_ComponentPairHashElement **ppOVar5;
  ON_SubD_FixedSizeHeap_ComponentPairHashElement *pOVar6;
  double *a_1;
  double *a_2;
  double *a_4;
  double *a_3;
  
  if ((ulong)this->m_h_capacity != 0) {
    memset(this->m_hash_table,0,(ulong)this->m_h_capacity << 3);
  }
  this->m_h_capacity = 0;
  this->m_h_count = 0;
  pOVar1 = this->m_v;
  pOVar2 = this->m_e;
  pOVar3 = this->m_f;
  pOVar4 = this->m_p;
  ppOVar5 = this->m_hash_table;
  pOVar6 = this->m_hash_elements;
  this->m_v = (ON_SubDVertex *)0x0;
  this->m_v_capacity = 0;
  this->m_v_index = 0;
  this->m_e = (ON_SubDEdge *)0x0;
  this->m_e_capacity = 0;
  this->m_e_index = 0;
  this->m_f = (ON_SubDFace *)0x0;
  this->m_f_capacity = 0;
  this->m_f_index = 0;
  this->m_p = (ON__UINT_PTR *)0x0;
  this->m_p_capacity = 0;
  this->m_p_index = 0;
  this->m_hash_table = (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)0x0;
  this->m_hash_elements = (ON_SubD_FixedSizeHeap_ComponentPairHashElement *)0x0;
  if (pOVar1 != (ON_SubDVertex *)0x0) {
    operator_delete__(pOVar1);
  }
  if (pOVar2 != (ON_SubDEdge *)0x0) {
    operator_delete__(pOVar2);
  }
  if (pOVar3 != (ON_SubDFace *)0x0) {
    operator_delete__(pOVar3);
  }
  if (pOVar4 != (ON__UINT_PTR *)0x0) {
    operator_delete__(pOVar4);
  }
  if (ppOVar5 != (ON_SubD_FixedSizeHeap_ComponentPairHashElement **)0x0) {
    operator_delete__(ppOVar5);
  }
  if (pOVar6 != (ON_SubD_FixedSizeHeap_ComponentPairHashElement *)0x0) {
    operator_delete__(pOVar6);
    return;
  }
  return;
}

Assistant:

void ON_SubD_FixedSizeHeap::Destroy()
{
  Reset();
  m_v_capacity = 0;
  m_e_capacity = 0;
  m_f_capacity = 0;
  m_p_capacity = 0;
  m_h_capacity = 0;
  m_h_count = 0;
  void* p[6] = { m_v, m_e, m_f, m_p, m_hash_table, m_hash_elements };
  m_v = nullptr;
  m_e = nullptr;
  m_f = nullptr;
  m_p = nullptr;
  m_hash_table = nullptr;
  m_hash_elements = nullptr;
  ON_SubD__Free(p[0]);
  ON_SubD__Free(p[1]);
  ON_SubD__Free(p[2]);
  ON_SubD__Free(p[3]);
  ON_SubD__Free(p[4]);
  ON_SubD__Free(p[5]);
}